

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::TagPattern::TagPattern(TagPattern *this,string *tag,string *filterString)

{
  string *in_RDX;
  Pattern *in_RDI;
  string *in_stack_ffffffffffffffc8;
  
  Pattern::Pattern(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_Pattern = (_func_int **)&PTR__TagPattern_00277e80;
  toLower(in_RDX);
  return;
}

Assistant:

TestSpec::TagPattern::TagPattern( std::string const& tag, std::string const& filterString )
    : Pattern( filterString )
    , m_tag( toLower( tag ) )
    {}